

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O0

int Wlc_PrsPrepare(Wlc_Prs_t *p)

{
  Vec_Int_t *p_00;
  bool bVar1;
  int iVar2;
  char *pStr;
  int k;
  int i;
  char *pThis;
  char *pPrev;
  char *pTemp;
  int fNotName;
  int fPrettyPrint;
  Wlc_Prs_t *p_local;
  
  bVar1 = true;
  iVar2 = Vec_IntSize(p->vLines);
  if (iVar2 != 0) {
    __assert_fail("Vec_IntSize(p->vLines) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadVer.c"
                  ,0x129,"int Wlc_PrsPrepare(Wlc_Prs_t *)");
  }
  for (pPrev = p->pBuffer; *pPrev != '\0'; pPrev = pPrev + 1) {
    if (*pPrev == '\n') {
      Vec_IntPush(p->vLines,(int)pPrev - (int)p->pBuffer);
    }
  }
  iVar2 = Wlc_PrsRemoveComments(p);
  if (iVar2 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    iVar2 = Vec_IntSize(p->vStarts);
    if (iVar2 != 0) {
      __assert_fail("Vec_IntSize(p->vStarts) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadVer.c"
                    ,0x131,"int Wlc_PrsPrepare(Wlc_Prs_t *)");
    }
    _k = p->pBuffer;
    pThis = _k;
    for (; *_k != '\0'; _k = _k + 1) {
      if ((bVar1) && (*_k == ';')) {
        *_k = '\0';
        p_00 = p->vStarts;
        pStr = Wlc_PrsSkipSpaces(pThis);
        iVar2 = Wlc_PrsOffset(p,pStr);
        Vec_IntPush(p_00,iVar2);
        pThis = _k + 1;
      }
      if (*_k == '\\') {
        bVar1 = false;
      }
      else if ((!bVar1) && (*_k == ' ')) {
        bVar1 = true;
      }
    }
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Wlc_PrsPrepare( Wlc_Prs_t * p )
{
    int fPrettyPrint = 0;
    int fNotName = 1;
    char * pTemp, * pPrev, * pThis;
    // collect info about lines
    assert( Vec_IntSize(p->vLines) == 0 );
    for ( pTemp = p->pBuffer; *pTemp; pTemp++ )
        if ( *pTemp == '\n' )
            Vec_IntPush( p->vLines, pTemp - p->pBuffer );
    // delete comments and insert breaks
    if ( !Wlc_PrsRemoveComments( p ) )
        return 0;
    // collect info about breaks
    assert( Vec_IntSize(p->vStarts) == 0 );
    for ( pPrev = pThis = p->pBuffer; *pThis; pThis++ )
    {
        if ( fNotName && *pThis == ';' )
        {
            *pThis = 0;
            Vec_IntPush( p->vStarts, Wlc_PrsOffset(p, Wlc_PrsSkipSpaces(pPrev)) );
            pPrev = pThis + 1;
        }
        if ( *pThis == '\\' )
            fNotName = 0;
        else if ( !fNotName && *pThis == ' ' )
            fNotName = 1;
    }

    if ( fPrettyPrint )
    {
        int i, k;
        // print the line types
        Wlc_PrsForEachLine( p, pTemp, i )
        {
            if ( Wlc_PrsStrCmp( pTemp, "module" ) )
                printf( "\n" );
            if ( !Wlc_PrsStrCmp( pTemp, "module" ) && !Wlc_PrsStrCmp( pTemp, "endmodule" ) )
                printf( "    " );
            printf( "%c", pTemp[0] );
            for ( k = 1; pTemp[k]; k++ )
                if ( pTemp[k] != ' ' || pTemp[k-1] != ' ' )
                    printf( "%c", pTemp[k] );
            printf( ";\n" );
        }
/*    
        // print the line types
        Wlc_PrsForEachLine( p, pTemp, i )
        {
            int k;  
            if ( !Wlc_PrsStrCmp( pTemp, "module" ) )
                continue;
            printf( "%3d : ", i );
            for ( k = 0; k < 40; k++ )
                printf( "%c", pTemp[k] ? pTemp[k] : ' ' );
            printf( "\n" );
        }
*/
    }
    return 1;
}